

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_1::createRandomCaseGroup
               (TestCaseGroup *parentGroup,Context *context,char *groupName,char *description,
               BufferMode bufferMode,deUint32 features,int numCases,deUint32 baseSeed)

{
  char *context_00;
  int iVar1;
  TestNode *pTVar2;
  TestContext *pTVar3;
  CommandLine *this;
  RandomSSBOLayoutCase *this_00;
  char *name;
  string local_68;
  int local_48 [2];
  int ndx;
  TestNode *local_38;
  TestCaseGroup *group;
  deUint32 features_local;
  BufferMode bufferMode_local;
  char *description_local;
  char *groupName_local;
  Context *context_local;
  TestCaseGroup *parentGroup_local;
  
  group._0_4_ = features;
  group._4_4_ = bufferMode;
  _features_local = description;
  description_local = groupName;
  groupName_local = (char *)context;
  context_local = (Context *)parentGroup;
  pTVar2 = (TestNode *)operator_new(0x70);
  pTVar3 = gles31::Context::getTestContext((Context *)groupName_local);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pTVar3,description_local,_features_local);
  local_38 = pTVar2;
  tcu::TestNode::addChild((TestNode *)context_local,pTVar2);
  pTVar3 = gles31::Context::getTestContext((Context *)groupName_local);
  this = tcu::TestContext::getCommandLine(pTVar3);
  iVar1 = tcu::CommandLine::getBaseSeed(this);
  for (local_48[0] = 0; pTVar2 = local_38, local_48[0] < numCases; local_48[0] = local_48[0] + 1) {
    this_00 = (RandomSSBOLayoutCase *)operator_new(0xe0);
    context_00 = groupName_local;
    de::toString<int>(&local_68,local_48);
    name = (char *)std::__cxx11::string::c_str();
    RandomSSBOLayoutCase::RandomSSBOLayoutCase
              (this_00,(Context *)context_00,name,"",group._4_4_,(deUint32)group,
               local_48[0] + iVar1 + baseSeed);
    tcu::TestNode::addChild(pTVar2,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return;
}

Assistant:

static void createRandomCaseGroup (tcu::TestCaseGroup* parentGroup, Context& context, const char* groupName, const char* description, SSBOLayoutCase::BufferMode bufferMode, deUint32 features, int numCases, deUint32 baseSeed)
{
	tcu::TestCaseGroup* group = new tcu::TestCaseGroup(context.getTestContext(), groupName, description);
	parentGroup->addChild(group);

	baseSeed += (deUint32)context.getTestContext().getCommandLine().getBaseSeed();

	for (int ndx = 0; ndx < numCases; ndx++)
		group->addChild(new RandomSSBOLayoutCase(context, de::toString(ndx).c_str(), "", bufferMode, features, (deUint32)ndx+baseSeed));
}